

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tga.cpp
# Opt level: O2

void embree::storeTga(Ref<embree::Image> *img,FileName *fileName)

{
  Image *pIVar1;
  size_t x;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float local_248;
  float fStack_244;
  float fStack_240;
  fstream file;
  
  std::fstream::fstream(&file);
  std::ios::exceptions((int)&file + (int)*(undefined8 *)(_file + -0x18));
  std::fstream::open((char *)&file,(_Ios_Openmode)(fileName->filename)._M_dataplus._M_p);
  fwrite_uchar('\0',&file);
  fwrite_uchar('\0',&file);
  fwrite_uchar('\x02',&file);
  fwrite_ushort(0,&file);
  fwrite_ushort(0,&file);
  fwrite_uchar('\0',&file);
  fwrite_ushort(0,&file);
  fwrite_ushort(0,&file);
  fwrite_ushort((unsigned_short)img->ptr->width,&file);
  fwrite_ushort((unsigned_short)img->ptr->height,&file);
  fwrite_uchar('\x18',&file);
  fwrite_uchar(' ',&file);
  pIVar1 = img->ptr;
  for (uVar3 = 0; uVar3 < pIVar1->height; uVar3 = uVar3 + 1) {
    for (uVar2 = 0; uVar2 < pIVar1->width; uVar2 = uVar2 + 1) {
      (*(pIVar1->super_RefCount)._vptr_RefCount[4])(&local_248,pIVar1,uVar2,uVar3);
      fVar5 = fStack_244;
      fVar7 = local_248;
      fVar4 = fStack_240;
      if (1.0 <= fStack_240) {
        fVar4 = 1.0;
      }
      fVar6 = 0.0;
      if (0.0 <= fVar4) {
        fVar6 = fVar4;
      }
      fwrite_uchar((uchar)(int)(fVar6 * 255.0),&file);
      if (1.0 <= fVar5) {
        fVar5 = 1.0;
      }
      fVar4 = 0.0;
      if (0.0 <= fVar5) {
        fVar4 = fVar5;
      }
      fwrite_uchar((uchar)(int)(fVar4 * 255.0),&file);
      if (1.0 <= fVar7) {
        fVar7 = 1.0;
      }
      fVar5 = 0.0;
      if (0.0 <= fVar7) {
        fVar5 = fVar7;
      }
      fwrite_uchar((uchar)(int)(fVar5 * 255.0),&file);
      pIVar1 = img->ptr;
    }
  }
  std::fstream::~fstream(&file);
  return;
}

Assistant:

void storeTga(const Ref<Image>& img, const FileName& fileName)
  {
    /* open file for reading */
    std::fstream file;
    file.exceptions (std::fstream::failbit | std::fstream::badbit);
    file.open (fileName.c_str(), std::fstream::out | std::fstream::binary);

    fwrite_uchar(0x00, file);
    fwrite_uchar(0x00, file);
    fwrite_uchar(0x02, file);
    fwrite_ushort(0x0000, file);
    fwrite_ushort(0x0000, file);
    fwrite_uchar(0x00, file);
    fwrite_ushort(0x0000, file);
    fwrite_ushort(0x0000, file);
    fwrite_ushort((unsigned short)img->width , file);
    fwrite_ushort((unsigned short)img->height, file);
    fwrite_uchar(0x18, file);
    fwrite_uchar(0x20, file);

    for (size_t y=0; y<img->height; y++) {
      for (size_t x=0; x<img->width; x++) {
        Color c = img->get(x,y);
        fwrite_uchar((unsigned char)(clamp(c.b)*255.0f), file);
        fwrite_uchar((unsigned char)(clamp(c.g)*255.0f), file);
        fwrite_uchar((unsigned char)(clamp(c.r)*255.0f), file);
      }
    }
  }